

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

int use_container(obj *obj,int held)

{
  obj *poVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int aiVar6 [1];
  obj **ppoVar7;
  long lVar8;
  char *pcVar9;
  char *planB;
  size_t sVar10;
  uint icount;
  byte bVar11;
  obj *poVar12;
  char *pcVar13;
  uint local_770;
  int selection [1];
  long local_768;
  char qbuf [256];
  char local_658 [256];
  char menuprompt [256];
  char emptymsg [256];
  nh_menuitem items [3];
  
  emptymsg[0] = '\0';
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pcVar13 = "You have no hands!";
LAB_00206735:
    local_770 = 0;
    goto LAB_00206737;
  }
  iVar4 = freehand();
  if (iVar4 == 0) {
    pcVar13 = body_part(6);
    pline("You have no free %s.",pcVar13);
    return 0;
  }
  pcVar13 = "";
  if (obj == &zeroobj) {
    current_container = &zeroobj;
    local_770 = 0;
  }
  else {
    if ((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) {
      pcVar13 = Tobjnam(obj,"seem");
      pline("%s to be locked.",pcVar13);
      if (held == 0) {
        return 0;
      }
      pcVar13 = "You must put it down to unlock.";
      goto LAB_00206735;
    }
    if ((short)*(uint *)&obj->field_0x4a < 0) {
      if (held != 0) {
        pcVar13 = xname(obj);
        pcVar13 = the(pcVar13);
        pline("You open %s...",pcVar13);
      }
      chest_trap(obj,6,'\0');
      if (multi < 0) {
        return 1;
      }
      nomul(-1,"opening a trapped container");
      nomovemsg = "";
      return 1;
    }
    local_770 = 0;
    current_container = obj;
    if (obj->spe == '\x01') {
      observe_quantum_cat(obj);
      local_770 = 1;
      pcVar13 = "now ";
    }
  }
  if (obj == &zeroobj) {
    ppoVar7 = &magic_chest_objs;
  }
  else {
    ppoVar7 = &obj->cobj;
  }
  local_768 = 0;
  iVar4 = 0;
  poVar12 = *ppoVar7;
  while (poVar12 != (obj *)0x0) {
    poVar1 = poVar12->nobj;
    if ((((obj == &zeroobj) || ((obj->otyp & 0xfffeU) != 0xe0)) || ((obj->field_0x4a & 1) == 0)) ||
       (uVar5 = mt_random(), uVar5 % 0xd != 0)) {
      iVar4 = iVar4 + 1;
      poVar12 = poVar1;
    }
    else {
      obj_extract_self(poVar12);
      lVar8 = mbag_item_gone(held,poVar12);
      local_768 = local_768 + lVar8;
      local_770 = 1;
      poVar12 = poVar1;
    }
  }
  if (local_768 != 0) {
    pcVar9 = currency(local_768);
    pline("You owe %ld %s for lost merchandise.",local_768,pcVar9);
  }
  if (obj == &zeroobj) {
    if (iVar4 == 0) {
      pcVar9 = "The magic chest";
      goto LAB_00206959;
    }
    bVar2 = true;
LAB_00206a01:
    builtin_strncpy(qbuf,"Do you want to take something out of ",0x26);
    pcVar13 = eos(qbuf);
    builtin_strncpy(pcVar13,"the magic chest?",0x11);
LAB_00206a19:
    poVar12 = invent;
    if (flags.menu_style != '\x03') {
      cVar3 = yn_function(qbuf,"ynq",'n');
      bVar2 = cVar3 == 'y';
      bVar11 = 0;
LAB_00206cec:
      if (bVar2 != false) {
        add_valid_menu_class::vmc_count = 0;
        valid_menu_classes[0] = '\0';
        iVar4 = menu_loot(0,current_container,'\0');
        local_770 = local_770 | iVar4 != 0;
      }
      goto LAB_00206d17;
    }
    if (invent != (obj *)0x0 || bVar2) {
      menuprompt[0] = '\0';
      if (!bVar2) {
        sprintf(menuprompt,"%s ",emptymsg);
      }
      sVar10 = strlen(menuprompt);
      poVar1 = current_container;
      builtin_strncpy(menuprompt + sVar10,"Do what?",9);
      uVar5 = 0;
      if (bVar2) {
        if (current_container == &zeroobj) {
          builtin_strncpy(local_658,"Take something out of the magic chest",0x26);
        }
        else {
          pcVar13 = xname(current_container);
          pcVar13 = the(pcVar13);
          sprintf(local_658,"Take something out of %s",pcVar13);
        }
        items[0].id = 1;
        items[0].role = MI_NORMAL;
        items[0].accel = 'o';
        items[0].group_accel = '\0';
        items[0].selected = '\0';
        strcpy(items[0].caption,local_658);
        uVar5 = 1;
      }
      icount = uVar5;
      if (poVar12 != (obj *)0x0) {
        if (poVar1 == &zeroobj) {
          builtin_strncpy(local_658,"Put something into the magic chest",0x23);
        }
        else {
          pcVar13 = xname(poVar1);
          pcVar13 = the(pcVar13);
          sprintf(local_658,"Put something into %s",pcVar13);
        }
        icount = uVar5 + 1;
        items[uVar5].id = 2;
        items[uVar5].role = MI_NORMAL;
        items[uVar5].accel = 'i';
        items[uVar5].group_accel = '\0';
        items[uVar5].selected = '\0';
        strcpy(items[uVar5].caption,local_658);
        if (bVar2) {
          items[icount].id = 3;
          items[icount].role = MI_NORMAL;
          items[icount].accel = 'b';
          items[icount].group_accel = '\0';
          items[icount].selected = '\0';
          builtin_strncpy(items[icount].caption,"Both of ",8);
          builtin_strncpy(items[icount].caption + 8,"the abov",8);
          items[icount].caption[0x10] = 'e';
          items[icount].caption[0x11] = '\0';
          icount = uVar5 | 2;
        }
      }
      aiVar6[0] = display_menu(items,icount,menuprompt,1,selection);
      if (0 < aiVar6[0]) {
        aiVar6[0] = selection[0];
      }
      if (aiVar6[0] < 1) {
        return 0;
      }
      bVar2 = (bool)((byte)aiVar6[0] & 1);
      bVar11 = (byte)aiVar6[0] >> 1 & 1;
      goto LAB_00206cec;
    }
    pline("%s",emptymsg);
  }
  else {
    uVar5 = weight(obj);
    obj->owt = uVar5;
    if (iVar4 != 0) {
      bVar2 = true;
LAB_002069b0:
      builtin_strncpy(qbuf,"Do you want to take something out of ",0x26);
      pcVar13 = eos(qbuf);
      pcVar9 = yname(obj);
      planB = ysimple_name(obj);
      pcVar9 = safe_qbuf(qbuf,1,pcVar9,planB,"it");
      sprintf(pcVar13,"%s?",pcVar9);
      goto LAB_00206a19;
    }
    pcVar9 = Yname2(obj);
LAB_00206959:
    sprintf(emptymsg,"%s is %sempty.",pcVar9,pcVar13);
    if (flags.menu_style == '\x03') {
      bVar2 = false;
      if (obj == &zeroobj) goto LAB_00206a01;
      goto LAB_002069b0;
    }
    bVar11 = 0;
    pline("%s",emptymsg);
LAB_00206d17:
    if (invent != (obj *)0x0) {
      if (flags.menu_style != '\x03') {
        builtin_strncpy(qbuf + 0x10,"ut something in?",0x11);
        builtin_strncpy(qbuf,"Do you wish to p",0x10);
        cVar3 = yn_function(qbuf,"ynq",'n');
        if (cVar3 == 'y') goto LAB_00206dbe;
        if (cVar3 != 'n') {
          if (cVar3 != 'm') {
            return local_770;
          }
          add_valid_menu_class::vmc_count = 0;
          valid_menu_classes[0] = '\0';
          iVar4 = menu_loot(-2,current_container,'\x01');
          local_770 = local_770 | iVar4 != 0;
        }
      }
      if (bVar11 == 0) {
        return local_770;
      }
LAB_00206dbe:
      add_valid_menu_class::vmc_count = 0;
      valid_menu_classes[0] = '\0';
      iVar4 = menu_loot(0,current_container,'\x01');
      return local_770 | iVar4 != 0;
    }
  }
  pcVar13 = "You don\'t have anything to put in.";
LAB_00206737:
  pline(pcVar13);
  return local_770;
}

Assistant:

int use_container(struct obj *obj, int held)
{
	struct obj *curr, *otmp;
	boolean quantum_cat = FALSE,
		loot_out = FALSE, loot_in = FALSE;
	char qbuf[BUFSZ], emptymsg[BUFSZ];
	long loss = 0L;
	int cnt = 0, used = 0,
	    menu_on_request;

	emptymsg[0] = '\0';
	if (nohands(youmonst.data)) {
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}

	if (!cobj_is_magic_chest(obj)) {
	    if (obj->olocked) {
		pline("%s to be locked.", Tobjnam(obj, "seem"));
		if (held) pline("You must put it down to unlock.");
		return 0;
	    } else if (obj->otrapped) {
		if (held) pline("You open %s...", the(xname(obj)));
		chest_trap(obj, HAND, FALSE);
		/* even if the trap fails, you've used up this turn */
		if (multi >= 0) {	/* in case we didn't become paralyzed */
		    nomul(-1, "opening a trapped container");
		    nomovemsg = "";
		}
		return 1;
	    }
	}

	current_container = obj;	/* for use by in/out_container */

	if (!cobj_is_magic_chest(obj) && obj->spe == 1) {
	    observe_quantum_cat(obj);
	    used = 1;
	    quantum_cat = TRUE;	/* for adjusting "it's empty" message */
	}

	/* Count the number of contained objects. Sometimes toss objects if */
	/* a cursed magic bag.						    */
	if (cobj_is_magic_chest(obj))
	    curr = magic_chest_objs;
	else
	    curr = obj->cobj;
	for (; curr; curr = otmp) {
	    otmp = curr->nobj;
	    if (!cobj_is_magic_chest(obj) && Is_mbag(obj) && obj->cursed && !rn2(13)) {
		obj_extract_self(curr);
		loss += mbag_item_gone(held, curr);
		used = 1;
	    } else {
		cnt++;
	    }
	}

	if (loss)	/* magic bag lost some shop goods */
	    pline("You owe %ld %s for lost merchandise.", loss, currency(loss));
	if (!cobj_is_magic_chest(obj))
	    obj->owt = weight(obj);	/* in case any items were lost */

	if (!cnt) {
	    sprintf(emptymsg, "%s is %sempty.",
		    cobj_is_magic_chest(obj) ? "The magic chest" : Yname2(obj),
		    quantum_cat ? "now " : "");
	}

	if (cnt || flags.menu_style == MENU_FULL) {
	    strcpy(qbuf, "Do you want to take something out of ");
	    if (cobj_is_magic_chest(obj)) {
		sprintf(eos(qbuf), "the magic chest?");
	    } else {
		sprintf(eos(qbuf), "%s?",
			safe_qbuf(qbuf, 1, yname(obj), ysimple_name(obj), "it"));
	    }

	    if (flags.menu_style == MENU_FULL) {
		int t;
		char menuprompt[BUFSZ];
		boolean outokay = (cnt != 0);
		boolean inokay = (invent != 0);

		if (!outokay && !inokay) {
		    pline("%s", emptymsg);
		    pline("You don't have anything to put in.");
		    return used;
		}
		menuprompt[0] = '\0';
		if (!cnt) sprintf(menuprompt, "%s ", emptymsg);
		strcat(menuprompt, "Do what?");
		t = in_or_out_menu(menuprompt, current_container, outokay, inokay);
		if (t <= 0) return 0;
		loot_out = (t & 0x01) != 0;
		loot_in  = (t & 0x02) != 0;
	    } else {	/* MENU_PARTIAL */
		loot_out = (yn_function(qbuf, ynqchars, 'n') == 'y');
	    }
	    
	    if (loot_out) {
		add_valid_menu_class(0);	/* reset */
		used |= menu_loot(0, current_container, FALSE) > 0;
	    }
	    
	} else {
	    pline("%s", emptymsg);		/* <whatever> is empty. */
	}

	if (!invent) {
	    /* nothing to put in, but some feedback is necessary */
	    pline("You don't have anything to put in.");
	    return used;
	}
	if (flags.menu_style != MENU_FULL) {
	    sprintf(qbuf, "Do you wish to put something in?");

	    switch (yn_function(qbuf, ynqchars, 'n')) {
		case 'y':
		    loot_in = TRUE;
		    break;
		case 'n':
		    break;
		case 'm':
		    add_valid_menu_class(0);	  /* reset */
		    menu_on_request = -2; /* triggers ALL_CLASSES */
		    used |= menu_loot(menu_on_request, current_container, TRUE) > 0;
		    break;
		case 'q':
		default:
		    return used;
	    }
	}
	/*
	 * Gone: being nice about only selecting food if we know we are
	 * putting things in an ice chest.
	 */
	if (loot_in) {
	    add_valid_menu_class(0);	  /* reset */
	    used |= menu_loot(0, current_container, TRUE) > 0;
	}

	return used;
}